

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

JointObservation * __thiscall
TransitionObservationIndependentMADPDiscrete::GetJointObservation
          (TransitionObservationIndependentMADPDiscrete *this,Index i)

{
  bool bVar1;
  const_reference ppJVar2;
  pointer ppVar3;
  value_type pJVar4;
  ulong uVar5;
  ulong uVar6;
  ObservationDiscrete *this_00;
  JointObservationDiscrete *this_01;
  long *in_RDI;
  pair<unsigned_int,_JointObservationDiscrete_*> pVar7;
  Index agI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ind_sI;
  JointObservationDiscrete *observation;
  Index in_stack_ffffffffffffff18;
  Index in_stack_ffffffffffffff1c;
  TransitionObservationIndependentMADPDiscrete *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  Index index;
  pair<unsigned_int,_JointObservationDiscrete_*> *__x;
  JointObservationDiscrete *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  Index jointI;
  uint local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  value_type local_38;
  _Base_ptr local_30;
  _Self local_28;
  _Self local_20 [3];
  value_type local_8;
  
  jointI = (Index)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  index = (Index)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  if ((*(byte *)((long)in_RDI + 0xca) & 1) == 0) {
    local_20[0]._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
         ::find((map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
                 *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                (key_type_conflict *)0xab779f);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
         ::end((map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
                *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    bVar1 = std::operator!=(local_20,&local_28);
    if (bVar1) {
      local_30 = (_Base_ptr)
                 std::
                 map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
                 ::find((map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                        (key_type_conflict *)0xab77f7);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>
                           *)in_stack_ffffffffffffff20);
      local_8 = ppVar3->second;
    }
    else {
      pJVar4 = (value_type)operator_new(0x48);
      JointObservationDiscrete::JointObservationDiscrete(in_stack_ffffffffffffff30,index);
      local_38 = pJVar4;
      IndexTools::JointToIndividualIndices(jointI,in_stack_ffffffffffffff50);
      local_64 = 0;
      while( true ) {
        uVar5 = (ulong)local_64;
        uVar6 = (**(code **)(*in_RDI + 0x10))();
        if (uVar6 <= uVar5) break;
        GetIndividualMADPD(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&local_60,(ulong)local_64);
        this_00 = MultiAgentDecisionProcessDiscrete::GetObservationDiscrete
                            ((MultiAgentDecisionProcessDiscrete *)in_stack_ffffffffffffff20,
                             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
        JointObservationDiscrete::AddIndividualObservation
                  ((JointObservationDiscrete *)this_00,
                   (ObservationDiscrete *)
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                   (Index)((ulong)in_stack_ffffffffffffff30 >> 0x20));
        local_64 = local_64 + 1;
      }
      __x = (pair<unsigned_int,_JointObservationDiscrete_*> *)in_RDI[0x49];
      pVar7 = std::make_pair<unsigned_int&,JointObservationDiscrete*&>
                        ((uint *)in_stack_ffffffffffffff20,
                         (JointObservationDiscrete **)
                         CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      this_01 = pVar7.second;
      std::
      map<unsigned_int,JointObservationDiscrete*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,JointObservationDiscrete*>>>
      ::insert<std::pair<unsigned_int,JointObservationDiscrete*>>
                ((map<unsigned_int,_JointObservationDiscrete_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_JointObservationDiscrete_*>_>_>
                  *)this_01,__x);
      local_8 = local_38;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01);
    }
  }
  else {
    ppJVar2 = std::vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>::
              at((vector<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_> *)
                 in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_8 = *ppJVar2;
  }
  return &local_8->super_JointObservation;
}

Assistant:

const JointObservation* 
TransitionObservationIndependentMADPDiscrete::GetJointObservation(Index i) const
{
    if(_m_jointIndicesCached) // we cached all joint obs
        return(_m_jointObs.at(i));
    // we cached the ones already asked for
    else if(_m_jointObsMap->find(i)!=_m_jointObsMap->end())
        return(_m_jointObsMap->find(i)->second);
    else // create new joint obs and add it to cache
    {
        JointObservationDiscrete *observation=new JointObservationDiscrete(i);
        vector<Index> ind_sI=
            IndexTools::JointToIndividualIndices(i,_m_nrIndivObs);
        for(Index agI = 0; agI < GetNrAgents(); agI++)
            observation->AddIndividualObservation(
                GetIndividualMADPD(agI)->GetObservationDiscrete(0,ind_sI[agI]),
                agI);
        
        _m_jointObsMap->insert(make_pair(i,observation));
        return(observation);
    }
}